

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_bds.cpp
# Opt level: O3

void BDS::ComputeAofs(MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,
                     MultiFab *umac,MultiFab *vmac,MultiFab *wmac,MultiFab *xedge,MultiFab *yedge,
                     MultiFab *zedge,int edge_comp,bool known_edgestate,MultiFab *xfluxes,
                     MultiFab *yfluxes,MultiFab *zfluxes,int fluxes_comp,MultiFab *fq,int fq_comp,
                     MultiFab *divu,BCRec *d_bc,Geometry *geom,
                     Vector<int,_std::allocator<int>_> *iconserv,Real dt,bool is_velocity)

{
  double dVar1;
  int iVar2;
  pointer piVar3;
  Geometry geom_00;
  int iVar4;
  pointer iconserv_00;
  FabArray<amrex::FArrayBox> *this;
  ulong uVar5;
  long lVar6;
  int iVar7;
  size_t __n;
  long lVar8;
  size_type a_capacity;
  Geometry *pGVar9;
  undefined8 *puVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  byte bVar17;
  undefined1 auVar18 [88];
  undefined1 auVar19 [48];
  undefined1 in_stack_fffffffffffff780 [160];
  undefined1 auVar20 [24];
  undefined8 in_stack_fffffffffffff820;
  Array4<const_double> *in_stack_fffffffffffff828;
  Array4<double> *in_stack_fffffffffffff830;
  Array4<const_double> *in_stack_fffffffffffff838;
  Array4<const_double> *in_stack_fffffffffffff840;
  int local_784;
  ulong local_780;
  Box local_744;
  DeviceVector<int> iconserv_d;
  double *local_6f8;
  double *local_6f0;
  double *local_6e8;
  double *local_6e0;
  Array4<const_double> local_6d0;
  Real local_690;
  FabArray<amrex::FArrayBox> *local_688;
  long local_680;
  long local_678;
  double *local_670;
  double *local_668;
  ulong local_660;
  long local_658;
  long local_650;
  long local_648;
  long local_640;
  long local_638;
  long local_630;
  long local_628;
  long local_620;
  long local_618;
  long local_610;
  long local_608;
  long local_600;
  long local_5f8;
  long local_5f0;
  long local_5e8;
  undefined **local_5e0;
  long local_5d8;
  long local_5d0;
  long local_5c8;
  double *local_5c0;
  double *local_5b8;
  ulong local_5b0;
  long local_5a8;
  long local_5a0;
  long local_598;
  long local_590;
  long local_588;
  long local_580;
  long local_578;
  long local_570;
  double *local_568;
  double *local_560;
  double *local_558;
  double *local_550;
  double *local_548;
  undefined **local_540;
  double *local_538;
  double *local_530;
  ulong local_528;
  long local_520;
  long local_518;
  Array4<const_double> local_510;
  Array4<double> local_4d0;
  Array4<double> local_490;
  Array4<double> local_450;
  Array4<const_double> local_410;
  Array<const_MultiFab_*,_3> u;
  int local_3a8;
  Array4<double> local_370;
  Array4<double> local_330;
  Array4<double> local_2f0;
  Array4<const_double> local_2b0;
  Array4<const_double> local_270;
  Array4<const_double> local_230;
  Array4<const_double> local_1f0;
  MultiFab divu_mac;
  
  bVar17 = 0;
  uVar14 = (long)(iconserv->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish -
           (long)(iconserv->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start >> 2;
  iconserv_d.m_data = (pointer)0x0;
  iconserv_d.m_size = 0;
  iconserv_d.m_capacity = 0;
  a_capacity = 0x10;
  if (0x10 < uVar14) {
    do {
      a_capacity = a_capacity * 3 + 1 >> 1;
    } while (a_capacity < uVar14);
  }
  local_690 = dt;
  amrex::PODVector<int,_std::allocator<int>_>::AllocateBuffer(&iconserv_d,a_capacity);
  piVar3 = (iconserv->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(iconserv->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish - (long)piVar3;
  iconserv_d.m_size = uVar14;
  if (__n != 0) {
    memcpy(iconserv_d.m_data,piVar3,__n);
  }
  iconserv_00 = iconserv_d.m_data;
  u._M_elems[0] = (MultiFab *)0x1;
  u._M_elems[1] = (MultiFab *)0x0;
  u._M_elems[2] = (MultiFab *)0x0;
  local_370.p = (double *)&PTR__FabFactory_0080b918;
  amrex::MultiFab::MultiFab
            (&divu_mac,&(state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
             &(state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,1,0,
             (MFInfo *)&u,(FabFactory<amrex::FArrayBox> *)&local_370);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(u._M_elems + 2));
  piVar3 = (iconserv->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(iconserv->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)piVar3 >> 2;
  if (0 < lVar6) {
    lVar8 = 0;
    do {
      if (piVar3[lVar8] == 0) {
        u._M_elems[1] = vmac;
        u._M_elems[2] = wmac;
        u._M_elems[0] = umac;
        amrex::computeDivergence(&divu_mac,&u,geom);
        break;
      }
      lVar8 = lVar8 + 1;
    } while (lVar6 != lVar8);
  }
  local_688 = &aofs->super_FabArray<amrex::FArrayBox>;
  amrex::MFIter::MFIter((MFIter *)&u,(FabArrayBase *)aofs,true);
  uVar5 = (ulong)(uint)ncomp;
  uVar14 = local_660;
  while (local_660 = uVar5, 0 < local_3a8) {
    amrex::MFIter::tilebox(&local_744,(MFIter *)&u);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_370,&xfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_2f0,&yfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_330,&zfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_450,&xedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,edge_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_490,&yedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,edge_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_4d0,&zedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,edge_comp);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_270,&umac->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_1f0,&vmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_230,&wmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
    if (!known_edgestate) {
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_510,&state->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,state_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_6d0,&divu->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_410,&fq->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fq_comp);
      pGVar9 = geom;
      puVar10 = (undefined8 *)&stack0xfffffffffffff780;
      for (lVar6 = 0x19; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar10 = *(undefined8 *)&pGVar9->super_CoordSys;
        pGVar9 = (Geometry *)((long)pGVar9 + (ulong)bVar17 * -0x10 + 8);
        puVar10 = puVar10 + (ulong)bVar17 * -2 + 1;
      }
      geom_00.roundoff_hi_f.arr[0] = (float)(int)in_stack_fffffffffffff820;
      geom_00.roundoff_hi_f.arr[1] = (float)(int)((ulong)in_stack_fffffffffffff820 >> 0x20);
      auVar18 = in_stack_fffffffffffff780._0_88_;
      auVar19 = in_stack_fffffffffffff780._88_48_;
      auVar20 = in_stack_fffffffffffff780._136_24_;
      geom_00.super_CoordSys.c_sys = auVar18._0_4_;
      geom_00.super_CoordSys._4_4_ = auVar18._4_4_;
      geom_00.super_CoordSys.offset[0] = (Real)auVar18._8_8_;
      geom_00.super_CoordSys.offset[1] = (Real)auVar18._16_8_;
      geom_00.super_CoordSys.offset[2] = (Real)auVar18._24_8_;
      geom_00.super_CoordSys.dx[0] = (Real)auVar18._32_8_;
      geom_00.super_CoordSys.dx[1] = (Real)auVar18._40_8_;
      geom_00.super_CoordSys.dx[2] = (Real)auVar18._48_8_;
      geom_00.super_CoordSys.inv_dx[0] = (Real)auVar18._56_8_;
      geom_00.super_CoordSys.inv_dx[1] = (Real)auVar18._64_8_;
      geom_00.super_CoordSys.inv_dx[2] = (Real)auVar18._72_8_;
      geom_00.super_CoordSys.ok = (bool)auVar18[0x50];
      geom_00.super_CoordSys._81_7_ = auVar18._81_7_;
      geom_00.prob_domain.xlo[0] = (Real)auVar19._0_8_;
      geom_00.prob_domain.xlo[1] = (Real)auVar19._8_8_;
      geom_00.prob_domain.xlo[2] = (Real)auVar19._16_8_;
      geom_00.prob_domain.xhi[0] = (Real)auVar19._24_8_;
      geom_00.prob_domain.xhi[1] = (Real)auVar19._32_8_;
      geom_00.prob_domain.xhi[2] = (Real)auVar19._40_8_;
      geom_00.roundoff_hi_d.arr[0] = (double)auVar20._0_8_;
      geom_00.roundoff_hi_d.arr[1] = (double)auVar20._8_8_;
      geom_00.roundoff_hi_d.arr[2] = (double)auVar20._16_8_;
      geom_00._168_8_ = in_stack_fffffffffffff828;
      geom_00.domain.smallend.vect._4_8_ = in_stack_fffffffffffff830;
      geom_00.domain.bigend.vect._0_8_ = in_stack_fffffffffffff838;
      geom_00.domain._20_8_ = in_stack_fffffffffffff840;
      ComputeEdgeState(&local_744,ncomp,&local_510,&local_450,&local_490,&local_4d0,&local_270,
                       &local_1f0,&local_230,&local_6d0,&local_410,geom_00,local_690,d_bc,
                       iconserv_00,is_velocity);
    }
    in_stack_fffffffffffff838 = &local_6d0;
    in_stack_fffffffffffff828 = &local_230;
    local_510.p = local_450.p;
    local_510.jstride = local_450.jstride;
    local_510.kstride = local_450.kstride;
    local_510.nstride = local_450.nstride;
    local_510.begin.z = local_450.begin.z;
    local_510.begin.x = local_450.begin.x;
    local_510.begin.y = local_450.begin.y;
    local_510.end.z = local_450.end.z;
    local_510.end.x = local_450.end.x;
    local_510.end.y = local_450.end.y;
    local_510.ncomp = local_450.ncomp;
    local_6d0.p = local_490.p;
    local_6d0.jstride = local_490.jstride;
    local_6d0.kstride = local_490.kstride;
    local_6d0.nstride = local_490.nstride;
    local_6d0.begin.z = local_490.begin.z;
    local_6d0.end.z = local_490.end.z;
    local_6d0.end.x = local_490.end.x;
    local_6d0.end.y = local_490.end.y;
    local_6d0.ncomp = local_490.ncomp;
    local_410.p = local_4d0.p;
    local_410.jstride = local_4d0.jstride;
    local_410.kstride = local_4d0.kstride;
    local_410.nstride = local_4d0.nstride;
    local_410.begin.z = local_4d0.begin.z;
    local_410.end.z = local_4d0.end.z;
    local_410.end.x = local_4d0.end.x;
    local_410.end.y = local_4d0.end.y;
    local_410.ncomp = local_4d0.ncomp;
    in_stack_fffffffffffff840 = &local_410;
    in_stack_fffffffffffff820 = 0x3b017c;
    in_stack_fffffffffffff830 = (Array4<double> *)&local_510;
    HydroUtils::ComputeFluxes
              (&local_744,&local_370,&local_2f0,&local_330,&local_270,&local_1f0,
               in_stack_fffffffffffff828,&local_510,in_stack_fffffffffffff838,
               in_stack_fffffffffffff840,geom,ncomp,true);
    this = local_688;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&local_510,local_688,(MFIter *)&u,aofs_comp);
    local_6d0.p = local_370.p;
    local_6d0.jstride = local_370.jstride;
    local_6d0.kstride = local_370.kstride;
    local_6d0.nstride = local_370.nstride;
    local_6d0.begin.z = local_370.begin.z;
    local_6d0.begin.x = local_370.begin.x;
    local_6d0.begin.y = local_370.begin.y;
    local_6d0.end.z = local_370.end.z;
    local_6d0.end.x = local_370.end.x;
    local_6d0.end.y = local_370.end.y;
    local_6d0.ncomp = local_370.ncomp;
    local_410.p = local_2f0.p;
    local_410.jstride = local_2f0.jstride;
    local_410.kstride = local_2f0.kstride;
    local_410.nstride = local_2f0.nstride;
    local_410.begin.z = local_2f0.begin.z;
    local_410.begin.x = local_2f0.begin.x;
    local_410.begin.y = local_2f0.begin.y;
    local_410.end.z = local_2f0.end.z;
    local_410.end.x = local_2f0.end.x;
    local_410.end.y = local_2f0.end.y;
    local_410.ncomp = local_2f0.ncomp;
    local_2b0.p = local_330.p;
    local_2b0.jstride = local_330.jstride;
    local_2b0.kstride = local_330.kstride;
    local_2b0.nstride = local_330.nstride;
    local_2b0.begin.z = local_330.begin.z;
    local_2b0.begin.x = local_330.begin.x;
    local_2b0.begin.y = local_330.begin.y;
    local_2b0.end.z = local_330.end.z;
    local_2b0.end.x = local_330.end.x;
    local_2b0.end.y = local_330.end.y;
    local_2b0.ncomp = local_330.ncomp;
    HydroUtils::ComputeDivergence
              (&local_744,(Array4<double> *)&local_510,&local_6d0,&local_410,&local_2b0,ncomp,geom,
               -1.0,true);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&local_510,this,(MFIter *)&u,aofs_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&local_6d0,&divu_mac.super_FabArray<amrex::FArrayBox>,(MFIter *)&u)
    ;
    if (0 < ncomp) {
      local_5c8 = (long)local_510.begin.z;
      local_518 = (long)local_510.begin.x;
      local_578 = (long)local_744.smallend.vect[0];
      local_520 = local_578 - local_518;
      local_668 = local_510.p;
      local_6e8 = local_510.p + (local_578 - local_518);
      local_5e0 = (undefined **)(local_6d0.p + (local_578 - local_6d0.begin.x));
      local_5e8 = -local_5c8;
      local_5d0 = local_6d0.kstride * 8;
      local_5d8 = -(long)local_6d0.begin.z;
      local_570 = local_6d0.jstride * 8;
      local_6f0 = local_4d0.p + (local_578 - local_4d0.begin.x);
      local_640 = local_4d0.nstride * 8;
      local_5f0 = local_4d0.kstride * 8;
      local_580 = local_4d0.jstride * 8;
      local_5f8 = -(long)local_4d0.begin.z;
      local_6f8 = local_490.p + (local_578 - local_490.begin.x);
      local_648 = local_490.nstride * 8;
      local_600 = local_490.kstride * 8;
      local_608 = -(long)local_490.begin.z;
      local_588 = local_490.jstride * 8;
      local_670 = local_450.p;
      local_6e0 = local_450.p + (local_578 - local_450.begin.x);
      local_610 = (long)local_450.begin.z;
      local_618 = -local_610;
      uVar11 = (local_744.smallend.vect[0] - local_450.begin.x) + 1;
      local_528 = (ulong)uVar11;
      local_5b0 = (ulong)(uint)local_744.bigend.vect[1];
      local_680 = local_510.nstride;
      local_650 = local_510.nstride * 8;
      local_628 = local_510.kstride;
      local_630 = local_510.kstride * 8;
      local_598 = local_510.jstride;
      local_5a0 = local_510.jstride * 8;
      local_678 = local_450.nstride;
      local_658 = local_450.nstride * 8;
      local_620 = local_450.kstride;
      local_638 = local_450.kstride * 8;
      local_590 = local_450.jstride;
      local_5a8 = local_450.jstride * 8;
      local_780 = 0;
      do {
        if (local_744.smallend.vect[2] <= local_744.bigend.vect[2]) {
          local_5b8 = local_510.p + local_780 * local_510.nstride;
          local_5c0 = local_450.p + local_780 * local_450.nstride;
          iVar4 = local_744.smallend.vect[2];
          local_784 = local_744.smallend.vect[2] - local_4d0.begin.z;
          do {
            local_784 = local_784 + 1;
            if (local_744.smallend.vect[1] <= local_744.bigend.vect[1]) {
              lVar6 = (long)iVar4;
              local_540 = (undefined **)((local_5d8 + lVar6) * local_5d0 + (long)local_5e0);
              local_560 = local_5b8 + (iVar4 - local_510.begin.z) * local_510.kstride;
              local_568 = local_5c0 + (iVar4 - local_450.begin.z) * local_450.kstride;
              local_538 = (double *)((local_5e8 + lVar6) * local_630 + (long)local_6e8);
              local_548 = (double *)(local_784 * local_5f0 + (long)local_6f0);
              local_550 = (double *)((local_5f8 + lVar6) * local_5f0 + (long)local_6f0);
              local_558 = (double *)((local_608 + lVar6) * local_600 + (long)local_6f8);
              local_530 = (double *)((lVar6 + local_618) * local_638 + (long)local_6e0);
              iVar7 = local_744.smallend.vect[1];
              do {
                if (local_744.smallend.vect[0] <= local_744.bigend.vect[0]) {
                  iVar2 = iconserv_00[local_780];
                  lVar8 = (iVar7 - local_4d0.begin.y) * local_580;
                  lVar15 = (iVar7 - local_510.begin.y) * local_5a0;
                  lVar13 = 0;
                  lVar6 = local_578;
                  do {
                    if (iVar2 == 0) {
                      lVar12 = local_520 + lVar13;
                      dVar1 = ((*(double *)((long)local_550 + lVar13 * 8 + lVar8) +
                                *(double *)((long)local_548 + lVar13 * 8 + lVar8) +
                               *(double *)
                                ((long)local_530 +
                                lVar13 * 8 + (iVar7 - local_450.begin.y) * local_5a8) +
                               local_568[local_450.jstride * (iVar7 - local_450.begin.y) +
                                         (long)(int)(uVar11 + (int)lVar13)] +
                               *(double *)
                                ((long)local_558 +
                                lVar13 * 8 + (iVar7 - local_490.begin.y) * local_588) +
                               *(double *)
                                ((long)local_558 +
                                lVar13 * 8 + ((iVar7 + 1) - local_490.begin.y) * local_588)) / 6.0)
                              * *(double *)
                                 ((long)local_540 +
                                 lVar13 * 8 + (iVar7 - local_6d0.begin.y) * local_570) +
                              *(double *)((long)local_538 + lVar13 * 8 + lVar15);
                      *(double *)((long)local_538 + lVar13 * 8 + lVar15) = dVar1;
                    }
                    else {
                      lVar12 = lVar6 - local_518;
                      dVar1 = *(double *)((long)local_538 + lVar13 * 8 + lVar15);
                    }
                    local_560[local_510.jstride * (iVar7 - local_510.begin.y) + lVar12] = -dVar1;
                    lVar13 = lVar13 + 1;
                    lVar6 = lVar6 + 1;
                  } while ((local_744.bigend.vect[0] - local_744.smallend.vect[0]) + 1 !=
                           (int)lVar13);
                }
                iVar7 = iVar7 + 1;
              } while (iVar7 != local_744.bigend.vect[1] + 1U);
            }
            bVar16 = iVar4 != local_744.bigend.vect[2];
            iVar4 = iVar4 + 1;
          } while (bVar16);
        }
        local_780 = local_780 + 1;
        local_6e8 = local_6e8 + local_510.nstride;
        local_6f0 = local_6f0 + local_4d0.nstride;
        local_6f8 = local_6f8 + local_490.nstride;
        local_6e0 = local_6e0 + local_450.nstride;
      } while (local_780 != local_660);
    }
    amrex::Gpu::Device::streamSynchronize();
    amrex::MFIter::operator++((MFIter *)&u);
    uVar5 = local_660;
    uVar14 = local_660;
  }
  local_660 = uVar14;
  amrex::MFIter::~MFIter((MFIter *)&u);
  amrex::MultiFab::~MultiFab(&divu_mac);
  if (iconserv_d.m_data != (pointer)0x0) {
    operator_delete(iconserv_d.m_data,iconserv_d.m_capacity << 2);
  }
  return;
}

Assistant:

void
BDS::ComputeAofs ( MultiFab& aofs,
                   const int aofs_comp,
                   const int ncomp,
                   MultiFab const& state,
                   const int state_comp,
                   AMREX_D_DECL( MultiFab const& umac,
                                 MultiFab const& vmac,
                                 MultiFab const& wmac),
                   AMREX_D_DECL( MultiFab& xedge,
                                 MultiFab& yedge,
                                 MultiFab& zedge),
                   const int  edge_comp,
                   const bool known_edgestate,
                   AMREX_D_DECL( MultiFab& xfluxes,
                                 MultiFab& yfluxes,
                                 MultiFab& zfluxes),
                   int fluxes_comp,
                   MultiFab const& fq,
                   const int fq_comp,
                   MultiFab const& divu,
                   BCRec const* d_bc,
                   Geometry const& geom,
                   Vector<int>& iconserv,
                   const Real dt,
                   const bool is_velocity)
{

    BL_PROFILE("BDS::ComputeAofs()");
    amrex::ignore_unused(divu);

    bool fluxes_are_area_weighted = true;

    // Make a device copy of the iconserv vector for use in kernels
    Gpu::DeviceVector<int> iconserv_d(iconserv.size());
    Gpu::copy(Gpu::hostToDevice, iconserv.begin(), iconserv.end(), iconserv_d.begin());
    int const* iconserv_ptr = iconserv_d.data();

    // If we need convective form, we must also compute div(u_mac)
    MultiFab divu_mac(state.boxArray(),state.DistributionMap(),1,0);;
    for (Long i = 0; i < iconserv.size(); ++i)
    {
        if (!iconserv[i])
        {
            Array<MultiFab const*,AMREX_SPACEDIM> u;
            AMREX_D_TERM(u[0] = &umac;,
                         u[1] = &vmac;,
                         u[2] = &wmac;);
            amrex::computeDivergence(divu_mac,u,geom);

            break;
        }
    }

#if (AMREX_SPACEDIM==2)
    if ( geom.IsRZ() )
    {
        Abort("BDS does not currently support cylindrical coordinates");
    }
#endif

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {

        const Box& bx   = mfi.tilebox();

        //
        // Get handlers to Array4
        //
        AMREX_D_TERM( const auto& fx = xfluxes.array(mfi,fluxes_comp);,
                      const auto& fy = yfluxes.array(mfi,fluxes_comp);,
                      const auto& fz = zfluxes.array(mfi,fluxes_comp););

        AMREX_D_TERM( const auto& xed = xedge.array(mfi,edge_comp);,
                      const auto& yed = yedge.array(mfi,edge_comp);,
                      const auto& zed = zedge.array(mfi,edge_comp););

        AMREX_D_TERM( const auto& u = umac.const_array(mfi);,
                      const auto& v = vmac.const_array(mfi);,
                      const auto& w = wmac.const_array(mfi););

        if ( !known_edgestate ) {
            BDS::ComputeEdgeState( bx, ncomp,
                                   state.array(mfi, state_comp),
                                   AMREX_D_DECL(xed, yed, zed),
                                   AMREX_D_DECL(u, v, w),
                                   divu.array(mfi),
                                   fq.array(mfi, fq_comp),
                                   geom, dt, d_bc, iconserv_ptr,
                                   is_velocity);
        }



        // Compute -div instead of computing div -- this is just for consistency
        // with the way we HAVE to do it for EB (because redistribution operates on
        // -div rather than div)
        Real mult = -1.0;

        HydroUtils::ComputeFluxes( bx,
                                   AMREX_D_DECL( fx, fy, fz ),
                                   AMREX_D_DECL( u, v, w ),
                                   AMREX_D_DECL( xed, yed, zed ),
                                   geom, ncomp, fluxes_are_area_weighted );

        HydroUtils::ComputeDivergence( bx,
                                       aofs.array(mfi,aofs_comp),
                                       AMREX_D_DECL( fx, fy, fz ),
                                       ncomp, geom,
                                       mult, fluxes_are_area_weighted);


        // Compute the convective form if needed and
        // flip the sign to return div
        auto const& aofs_arr  = aofs.array(mfi, aofs_comp);
        auto const& divu_arr  = divu_mac.array(mfi);
        amrex::ParallelFor(bx, ncomp, [=]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (!iconserv_ptr[n])
            {
                Real q = xed(i,j,k,n) + xed(i+1,j,k,n)
                       + yed(i,j,k,n) + yed(i,j+1,k,n);
#if (AMREX_SPACEDIM == 2)
                q *= 0.25;
#else
                q += zed(i,j,k,n) + zed(i,j,k+1,n);
                q /= 6.0;
#endif
                aofs_arr(i,j,k,n) += q*divu_arr(i,j,k);
            }

            aofs_arr( i, j, k, n ) *=  - 1.0;
        });

        //
        // NOTE this sync cannot protect temporaries in ComputeEdgeState, ComputeFluxes
        // or ComputeDivergence, since functions have their own scope. As soon as the
        // CPU hits the end of the function, it will call the destructor for all
        // temporaries created in that function.
        //
        Gpu::streamSynchronize();  // otherwise we might be using too much memory
    }

}